

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Utility.cpp
# Opt level: O0

void __thiscall
UtilityTest_Pack8Test_Test::UtilityTest_Pack8Test_Test(UtilityTest_Pack8Test_Test *this)

{
  UtilityTest_Pack8Test_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__UtilityTest_Pack8Test_Test_00196810;
  return;
}

Assistant:

TEST(UtilityTest, Pack8Test) {
    // Test case 1: Packing a single byte
    uint8_t data1[1];
    size_t offset1 = Pack8(data1, 0, 0xAB);
    EXPECT_EQ(offset1, 1);
    EXPECT_EQ(data1[0], 0xAB);

    // Test case 2: Packing a byte at a non-zero offset
    uint8_t data2[3] = {0x00, 0x00, 0x00};
    size_t offset2 = Pack8(data2, 1, 0x34);
    EXPECT_EQ(offset2, 2);
    EXPECT_EQ(data2[1], 0x34);

    // Test case 3: Packing a byte in a larger array
    uint8_t data3[5] = {0x00, 0x00, 0x00, 0x00, 0x00};
    size_t offset3 = Pack8(data3, 3, 0x44);
    EXPECT_EQ(offset3, 4);
    EXPECT_EQ(data3[3], 0x44);
}